

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

bool __thiscall phpconvert::ZendParser::isKeyword(ZendParser *this,string *tmpClassNameLower)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *tmpClassNameLower_local;
  ZendParser *this_local;
  
  local_18 = tmpClassNameLower;
  tmpClassNameLower_local = (string *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(this->keywords,tmpClassNameLower);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this->keywords);
  bVar1 = std::operator!=(&local_20,&local_28);
  return bVar1;
}

Assistant:

bool ZendParser::isKeyword(const string &tmpClassNameLower) {
        return keywords->find(tmpClassNameLower)
               != keywords->end();
    }